

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGCompile(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def)

{
  xmlAutomataPtr pxVar1;
  int iVar2;
  xmlAutomataPtr pxVar3;
  xmlAutomataStatePtr pxVar4;
  _xmlRegexp *p_Var5;
  xmlAutomataStatePtr pxVar6;
  xmlChar *str1;
  xmlAutomataStatePtr oldstate_6;
  xmlAutomataStatePtr oldstate_5;
  xmlAutomataStatePtr target;
  xmlAutomataStatePtr oldstate_4;
  xmlAutomataStatePtr oldstate_3;
  xmlAutomataStatePtr oldstate_2;
  xmlAutomataPtr oldam_2;
  xmlAutomataStatePtr oldstate_1;
  xmlAutomataPtr oldam_1;
  xmlAutomataStatePtr oldstate;
  xmlAutomataPtr oldam;
  xmlRelaxNGDefinePtr_conflict list;
  int ret;
  xmlRelaxNGDefinePtr_conflict def_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  list._4_4_ = 0;
  if ((ctxt == (xmlRelaxNGParserCtxtPtr)0x0) || (def == (xmlRelaxNGDefinePtr_conflict)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    switch(def->type) {
    case XML_RELAXNG_EMPTY:
      pxVar6 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar6;
      break;
    case XML_RELAXNG_NOT_ALLOWED:
    case XML_RELAXNG_EXCEPT:
    case XML_RELAXNG_DATATYPE:
    case XML_RELAXNG_PARAM:
    case XML_RELAXNG_VALUE:
    case XML_RELAXNG_LIST:
    case XML_RELAXNG_ATTRIBUTE:
    case XML_RELAXNG_INTERLEAVE:
      str1 = (xmlChar *)xmlRelaxNGDefName(def);
      xmlRngPErr(ctxt,(xmlNodePtr)0x0,1,"RNG internal error trying to compile %s\n",str1,
                 (xmlChar *)0x0);
      break;
    case XML_RELAXNG_TEXT:
      pxVar6 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar6;
      pxVar6 = ctxt->state;
      xmlRelaxNGCompile(ctxt,def->content);
      xmlAutomataNewTransition(ctxt->am,ctxt->state,ctxt->state,(xmlChar *)"#text",(void *)0x0);
      pxVar6 = xmlAutomataNewEpsilon(ctxt->am,pxVar6,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar6;
      break;
    case XML_RELAXNG_ELEMENT:
      if ((ctxt->am != (xmlAutomataPtr)0x0) && (def->name != (xmlChar *)0x0)) {
        pxVar6 = xmlAutomataNewTransition2
                           (ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,def->name,def->ns,def);
        ctxt->state = pxVar6;
      }
      if (((def->dflags & 0x40U) == 0) || (def->depth == -0x19)) {
        pxVar1 = ctxt->am;
        list._4_4_ = xmlRelaxNGTryCompile(ctxt,def);
        ctxt->am = pxVar1;
      }
      else {
        pxVar1 = ctxt->am;
        pxVar6 = ctxt->state;
        def->depth = -0x19;
        oldam = (xmlAutomataPtr)def->content;
        pxVar3 = xmlNewAutomata();
        ctxt->am = pxVar3;
        if (ctxt->am == (xmlAutomataPtr)0x0) {
          return -1;
        }
        xmlAutomataSetFlags(ctxt->am,1);
        pxVar4 = xmlAutomataGetInitState(ctxt->am);
        ctxt->state = pxVar4;
        for (; oldam != (xmlAutomataPtr)0x0; oldam = (xmlAutomataPtr)oldam->atoms) {
          xmlRelaxNGCompile(ctxt,(xmlRelaxNGDefinePtr_conflict)oldam);
        }
        xmlAutomataSetFinalState(ctxt->am,ctxt->state);
        p_Var5 = xmlAutomataCompile(ctxt->am);
        def->contModel = p_Var5;
        iVar2 = xmlRegexpIsDeterminist(def->contModel);
        if (iVar2 == 0) {
          xmlRegFreeRegexp(def->contModel);
          def->contModel = (xmlRegexpPtr)0x0;
        }
        xmlFreeAutomata(ctxt->am);
        ctxt->state = pxVar6;
        ctxt->am = pxVar1;
      }
      break;
    case XML_RELAXNG_DEF:
    case XML_RELAXNG_REF:
    case XML_RELAXNG_EXTERNALREF:
    case XML_RELAXNG_PARENTREF:
    case XML_RELAXNG_GROUP:
      oldam = (xmlAutomataPtr)def->content;
      while ((oldam != (xmlAutomataPtr)0x0 &&
             (list._4_4_ = xmlRelaxNGCompile(ctxt,(xmlRelaxNGDefinePtr_conflict)oldam),
             list._4_4_ == 0))) {
        oldam = (xmlAutomataPtr)oldam->atoms;
      }
      break;
    case XML_RELAXNG_OPTIONAL:
      pxVar6 = ctxt->state;
      for (oldam = (xmlAutomataPtr)def->content; oldam != (xmlAutomataPtr)0x0;
          oldam = (xmlAutomataPtr)oldam->atoms) {
        xmlRelaxNGCompile(ctxt,(xmlRelaxNGDefinePtr_conflict)oldam);
      }
      xmlAutomataNewEpsilon(ctxt->am,pxVar6,ctxt->state);
      break;
    case XML_RELAXNG_ZEROORMORE:
      pxVar6 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar6;
      pxVar6 = ctxt->state;
      for (oldam = (xmlAutomataPtr)def->content; oldam != (xmlAutomataPtr)0x0;
          oldam = (xmlAutomataPtr)oldam->atoms) {
        xmlRelaxNGCompile(ctxt,(xmlRelaxNGDefinePtr_conflict)oldam);
      }
      xmlAutomataNewEpsilon(ctxt->am,ctxt->state,pxVar6);
      pxVar6 = xmlAutomataNewEpsilon(ctxt->am,pxVar6,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar6;
      break;
    case XML_RELAXNG_ONEORMORE:
      for (oldam = (xmlAutomataPtr)def->content; oldam != (xmlAutomataPtr)0x0;
          oldam = (xmlAutomataPtr)oldam->atoms) {
        xmlRelaxNGCompile(ctxt,(xmlRelaxNGDefinePtr_conflict)oldam);
      }
      pxVar6 = ctxt->state;
      for (oldam = (xmlAutomataPtr)def->content; oldam != (xmlAutomataPtr)0x0;
          oldam = (xmlAutomataPtr)oldam->atoms) {
        xmlRelaxNGCompile(ctxt,(xmlRelaxNGDefinePtr_conflict)oldam);
      }
      xmlAutomataNewEpsilon(ctxt->am,ctxt->state,pxVar6);
      pxVar6 = xmlAutomataNewEpsilon(ctxt->am,pxVar6,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar6;
      break;
    case XML_RELAXNG_CHOICE:
      oldstate_5 = (xmlAutomataStatePtr)0x0;
      pxVar6 = ctxt->state;
      for (oldam = (xmlAutomataPtr)def->content; oldam != (xmlAutomataPtr)0x0;
          oldam = (xmlAutomataPtr)oldam->atoms) {
        ctxt->state = pxVar6;
        list._4_4_ = xmlRelaxNGCompile(ctxt,(xmlRelaxNGDefinePtr_conflict)oldam);
        if (list._4_4_ != 0) break;
        if (oldstate_5 == (xmlAutomataStatePtr)0x0) {
          oldstate_5 = ctxt->state;
        }
        else {
          xmlAutomataNewEpsilon(ctxt->am,ctxt->state,oldstate_5);
        }
      }
      ctxt->state = oldstate_5;
      break;
    case XML_RELAXNG_START:
      iVar2 = xmlRelaxNGIsCompilable(def);
      if ((iVar2 == 1) && (def->depth != -0x19)) {
        pxVar1 = ctxt->am;
        pxVar6 = ctxt->state;
        def->depth = -0x19;
        oldam = (xmlAutomataPtr)def->content;
        pxVar3 = xmlNewAutomata();
        ctxt->am = pxVar3;
        if (ctxt->am == (xmlAutomataPtr)0x0) {
          return -1;
        }
        xmlAutomataSetFlags(ctxt->am,1);
        pxVar4 = xmlAutomataGetInitState(ctxt->am);
        ctxt->state = pxVar4;
        for (; oldam != (xmlAutomataPtr)0x0; oldam = (xmlAutomataPtr)oldam->atoms) {
          xmlRelaxNGCompile(ctxt,(xmlRelaxNGDefinePtr_conflict)oldam);
        }
        xmlAutomataSetFinalState(ctxt->am,ctxt->state);
        iVar2 = xmlAutomataIsDeterminist(ctxt->am);
        if (iVar2 != 0) {
          p_Var5 = xmlAutomataCompile(ctxt->am);
          def->contModel = p_Var5;
        }
        xmlFreeAutomata(ctxt->am);
        ctxt->state = pxVar6;
        ctxt->am = pxVar1;
      }
      break;
    case XML_RELAXNG_NOOP:
      list._4_4_ = xmlRelaxNGCompile(ctxt,def->content);
    }
    ctxt_local._4_4_ = list._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGCompile(xmlRelaxNGParserCtxtPtr ctxt, xmlRelaxNGDefinePtr def)
{
    int ret = 0;
    xmlRelaxNGDefinePtr list;

    if ((ctxt == NULL) || (def == NULL))
        return (-1);

    switch (def->type) {
        case XML_RELAXNG_START:
            if ((xmlRelaxNGIsCompilable(def) == 1) && (def->depth != -25)) {
                xmlAutomataPtr oldam = ctxt->am;
                xmlAutomataStatePtr oldstate = ctxt->state;

                def->depth = -25;

                list = def->content;
                ctxt->am = xmlNewAutomata();
                if (ctxt->am == NULL)
                    return (-1);

                /*
                 * assume identical strings but not same pointer are different
                 * atoms, needed for non-determinism detection
                 * That way if 2 elements with the same name are in a choice
                 * branch the automata is found non-deterministic and
                 * we fallback to the normal validation which does the right
                 * thing of exploring both choices.
                 */
                xmlAutomataSetFlags(ctxt->am, 1);

                ctxt->state = xmlAutomataGetInitState(ctxt->am);
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataSetFinalState(ctxt->am, ctxt->state);
                if (xmlAutomataIsDeterminist(ctxt->am))
                    def->contModel = xmlAutomataCompile(ctxt->am);

                xmlFreeAutomata(ctxt->am);
                ctxt->state = oldstate;
                ctxt->am = oldam;
            }
            break;
        case XML_RELAXNG_ELEMENT:
            if ((ctxt->am != NULL) && (def->name != NULL)) {
                ctxt->state = xmlAutomataNewTransition2(ctxt->am,
                                                        ctxt->state, NULL,
                                                        def->name, def->ns,
                                                        def);
            }
            if ((def->dflags & IS_COMPILABLE) && (def->depth != -25)) {
                xmlAutomataPtr oldam = ctxt->am;
                xmlAutomataStatePtr oldstate = ctxt->state;

                def->depth = -25;

                list = def->content;
                ctxt->am = xmlNewAutomata();
                if (ctxt->am == NULL)
                    return (-1);
                xmlAutomataSetFlags(ctxt->am, 1);
                ctxt->state = xmlAutomataGetInitState(ctxt->am);
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataSetFinalState(ctxt->am, ctxt->state);
                def->contModel = xmlAutomataCompile(ctxt->am);
                if (!xmlRegexpIsDeterminist(def->contModel)) {
                    /*
                     * we can only use the automata if it is determinist
                     */
                    xmlRegFreeRegexp(def->contModel);
                    def->contModel = NULL;
                }
                xmlFreeAutomata(ctxt->am);
                ctxt->state = oldstate;
                ctxt->am = oldam;
            } else {
                xmlAutomataPtr oldam = ctxt->am;

                /*
                 * we can't build the content model for this element content
                 * but it still might be possible to build it for some of its
                 * children, recurse.
                 */
                ret = xmlRelaxNGTryCompile(ctxt, def);
                ctxt->am = oldam;
            }
            break;
        case XML_RELAXNG_NOOP:
            ret = xmlRelaxNGCompile(ctxt, def->content);
            break;
        case XML_RELAXNG_OPTIONAL:{
                xmlAutomataStatePtr oldstate = ctxt->state;

                list = def->content;
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
                break;
            }
        case XML_RELAXNG_ZEROORMORE:{
                xmlAutomataStatePtr oldstate;

                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, ctxt->state, NULL);
                oldstate = ctxt->state;
                list = def->content;
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataNewEpsilon(ctxt->am, ctxt->state, oldstate);
                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, oldstate, NULL);
                break;
            }
        case XML_RELAXNG_ONEORMORE:{
                xmlAutomataStatePtr oldstate;

                list = def->content;
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                oldstate = ctxt->state;
                list = def->content;
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataNewEpsilon(ctxt->am, ctxt->state, oldstate);
                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, oldstate, NULL);
                break;
            }
        case XML_RELAXNG_CHOICE:{
                xmlAutomataStatePtr target = NULL;
                xmlAutomataStatePtr oldstate = ctxt->state;

                list = def->content;
                while (list != NULL) {
                    ctxt->state = oldstate;
                    ret = xmlRelaxNGCompile(ctxt, list);
                    if (ret != 0)
                        break;
                    if (target == NULL)
                        target = ctxt->state;
                    else {
                        xmlAutomataNewEpsilon(ctxt->am, ctxt->state,
                                              target);
                    }
                    list = list->next;
                }
                ctxt->state = target;

                break;
            }
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
        case XML_RELAXNG_GROUP:
        case XML_RELAXNG_DEF:
            list = def->content;
            while (list != NULL) {
                ret = xmlRelaxNGCompile(ctxt, list);
                if (ret != 0)
                    break;
                list = list->next;
            }
            break;
        case XML_RELAXNG_TEXT:{
                xmlAutomataStatePtr oldstate;

                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, ctxt->state, NULL);
                oldstate = ctxt->state;
                xmlRelaxNGCompile(ctxt, def->content);
                xmlAutomataNewTransition(ctxt->am, ctxt->state,
                                         ctxt->state, BAD_CAST "#text",
                                         NULL);
                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, oldstate, NULL);
                break;
            }
        case XML_RELAXNG_EMPTY:
            ctxt->state =
                xmlAutomataNewEpsilon(ctxt->am, ctxt->state, NULL);
            break;
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_ATTRIBUTE:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_NOT_ALLOWED:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
            xmlRngPErr(ctxt, NULL, XML_ERR_INTERNAL_ERROR,
                       "RNG internal error trying to compile %s\n",
                       BAD_CAST xmlRelaxNGDefName(def), NULL);
            break;
    }
    return (ret);
}